

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall TestStreamWriterTestwriteZeroes::runTestCase(TestStreamWriterTestwriteZeroes *this)

{
  TestResult *result;
  Value *this_00;
  Value *file;
  long in_RDI;
  string out_1;
  Value root_1;
  string out;
  Value root;
  StreamWriterBuilder b;
  string expected;
  string binary;
  Value *in_stack_fffffffffffffd18;
  Value *in_stack_fffffffffffffd20;
  uint line;
  StreamWriterBuilder *this_01;
  string *in_stack_fffffffffffffd28;
  StreamWriterBuilder *in_stack_fffffffffffffd30;
  string *in_stack_fffffffffffffd38;
  string *expected_00;
  TestResult *in_stack_fffffffffffffd40;
  Value *in_stack_fffffffffffffd50;
  Value *this_02;
  string local_278 [32];
  string local_258 [32];
  string local_238 [32];
  string local_218 [32];
  string local_1f8 [112];
  string local_188 [32];
  string local_168 [32];
  string local_148 [8];
  Value *in_stack_fffffffffffffec0;
  Factory *in_stack_fffffffffffffec8;
  string local_128 [32];
  string local_108 [64];
  Value *in_stack_ffffffffffffff38;
  allocator local_61;
  string local_60 [55];
  allocator local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"hi",3,&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  std::__cxx11::string::length();
  JsonTest::checkEqual<int,unsigned_long>
            (in_stack_fffffffffffffd40,(int)((ulong)in_stack_fffffffffffffd38 >> 0x20),
             (unsigned_long)in_stack_fffffffffffffd30,(char *)in_stack_fffffffffffffd28,
             (uint)((ulong)in_stack_fffffffffffffd20 >> 0x20),(char *)in_stack_fffffffffffffd18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"\"hi\\u0000\"",&local_61);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  Json::StreamWriterBuilder::StreamWriterBuilder(in_stack_fffffffffffffd30);
  Json::Value::Value((Value *)in_stack_fffffffffffffd30,
                     (ValueType)((ulong)in_stack_fffffffffffffd28 >> 0x20));
  Json::Value::Value((Value *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  Json::Value::operator=(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  Json::Value::~Value(in_stack_fffffffffffffd50);
  std::__cxx11::string::string(local_108,local_28);
  Json::Value::asString_abi_cxx11_(in_stack_ffffffffffffff38);
  JsonTest::checkStringEqual
            (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,(string *)in_stack_fffffffffffffd30
             ,(char *)in_stack_fffffffffffffd28,(uint)((ulong)in_stack_fffffffffffffd20 >> 0x20),
             (char *)in_stack_fffffffffffffd18);
  std::__cxx11::string::~string(local_128);
  std::__cxx11::string::~string(local_108);
  Json::writeString_abi_cxx11_(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  this_02 = *(Value **)(in_RDI + 8);
  std::__cxx11::string::size();
  std::__cxx11::string::size();
  JsonTest::checkEqual<unsigned_long,unsigned_long>
            (in_stack_fffffffffffffd40,(unsigned_long)in_stack_fffffffffffffd38,
             (unsigned_long)in_stack_fffffffffffffd30,(char *)in_stack_fffffffffffffd28,
             (uint)((ulong)in_stack_fffffffffffffd20 >> 0x20),(char *)in_stack_fffffffffffffd18);
  std::__cxx11::string::string(local_168,local_60);
  std::__cxx11::string::string(local_188,local_148);
  JsonTest::checkStringEqual
            (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,(string *)in_stack_fffffffffffffd30
             ,(char *)in_stack_fffffffffffffd28,(uint)((ulong)in_stack_fffffffffffffd20 >> 0x20),
             (char *)in_stack_fffffffffffffd18);
  std::__cxx11::string::~string(local_188);
  std::__cxx11::string::~string(local_168);
  std::__cxx11::string::~string(local_148);
  Json::Value::~Value(this_02);
  Json::Value::Value((Value *)in_stack_fffffffffffffd30,
                     (ValueType)((ulong)in_stack_fffffffffffffd28 >> 0x20));
  Json::Value::Value((Value *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  result = (TestResult *)
           Json::Value::operator[]
                     ((Value *)in_stack_fffffffffffffd30,(char *)in_stack_fffffffffffffd28);
  Json::Value::operator=(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  line = (uint)((ulong)in_stack_fffffffffffffd20 >> 0x20);
  Json::Value::~Value(this_02);
  expected_00 = *(string **)(in_RDI + 8);
  std::__cxx11::string::string(local_1f8,local_28);
  this_00 = Json::Value::operator[]
                      ((Value *)in_stack_fffffffffffffd30,(char *)in_stack_fffffffffffffd28);
  Json::Value::asString_abi_cxx11_(in_stack_ffffffffffffff38);
  JsonTest::checkStringEqual
            (result,expected_00,(string *)this_00,(char *)in_stack_fffffffffffffd28,line,
             (char *)in_stack_fffffffffffffd18);
  std::__cxx11::string::~string(local_218);
  std::__cxx11::string::~string(local_1f8);
  file = Json::Value::operator[](this_00,(char *)in_stack_fffffffffffffd28);
  Json::writeString_abi_cxx11_(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  this_01 = *(StreamWriterBuilder **)(in_RDI + 8);
  std::__cxx11::string::string(local_258,local_60);
  std::__cxx11::string::string(local_278,local_238);
  JsonTest::checkStringEqual
            (result,expected_00,(string *)this_00,(char *)file,(uint)((ulong)this_01 >> 0x20),
             (char *)in_stack_fffffffffffffd18);
  std::__cxx11::string::~string(local_278);
  std::__cxx11::string::~string(local_258);
  std::__cxx11::string::~string(local_238);
  Json::Value::~Value(this_02);
  Json::StreamWriterBuilder::~StreamWriterBuilder(this_01);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

JSONTEST_FIXTURE(StreamWriterTest, writeZeroes) {
  std::string binary("hi", 3);  // include trailing 0
  JSONTEST_ASSERT_EQUAL(3, binary.length());
  std::string expected("\"hi\\u0000\"");  // unicoded zero
  Json::StreamWriterBuilder b;
  {
    Json::Value root;
    root = binary;
    JSONTEST_ASSERT_STRING_EQUAL(binary, root.asString());
    std::string out = Json::writeString(b, root);
    JSONTEST_ASSERT_EQUAL(expected.size(), out.size());
    JSONTEST_ASSERT_STRING_EQUAL(expected, out);
  }
  {
    Json::Value root;
    root["top"] = binary;
    JSONTEST_ASSERT_STRING_EQUAL(binary, root["top"].asString());
    std::string out = Json::writeString(b, root["top"]);
    JSONTEST_ASSERT_STRING_EQUAL(expected, out);
  }
}